

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

bool __thiscall
gmlc::networking::TcpConnection::waitUntilConnected(TcpConnection *this,milliseconds timeOut)

{
  bool bVar1;
  strong_ordering sVar2;
  TriggerVariable *in_RSI;
  milliseconds *unaff_retaddr;
  TriggerVariable *in_stack_00000008;
  TcpConnection *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = isConnected(in_stack_ffffffffffffffd0);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    ms<(char)48>();
    sVar2 = CLI::std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_RSI);
    CLI::std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffd7,(__unspec *)0x0);
    bVar1 = CLI::std::operator<(sVar2._M_value);
    if (bVar1) {
      concurrency::TriggerVariable::waitActivation(in_RSI);
      bVar1 = isConnected(in_stack_ffffffffffffffd0);
    }
    else {
      concurrency::TriggerVariable::wait_forActivation(in_stack_00000008,unaff_retaddr);
      bVar1 = isConnected(in_stack_ffffffffffffffd0);
    }
  }
  return bVar1;
}

Assistant:

bool TcpConnection::waitUntilConnected(std::chrono::milliseconds timeOut)
{
    if (isConnected()) {
        return true;
    }
    if (timeOut < 0ms) {
        connected.waitActivation();
        return isConnected();
    }
    connected.wait_forActivation(timeOut);
    return isConnected();
}